

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_common_v1.hpp
# Opt level: O0

void __thiscall LASwavepacket13::pack(LASwavepacket13 *this,U8 *item)

{
  U8 *item_local;
  LASwavepacket13 *this_local;
  
  packU32((U32)this->offset,item);
  packU32((U32)(this->offset >> 0x20),item + 4);
  packU32(this->packet_size,item + 8);
  packU32((this->return_point).u32,item + 0xc);
  packU32((this->x).u32,item + 0x10);
  packU32((this->y).u32,item + 0x14);
  packU32((this->z).u32,item + 0x18);
  return;
}

Assistant:

void inline pack(U8 *item)
  {
    // pack a LAS wavepacket into raw memory
    packU32((U32)(offset & 0xFFFFFFFF), item);
    packU32((U32)(offset >> 32), item+4);

    packU32(packet_size, item + 8);
    packU32(return_point.u32, item + 12);
    packU32(x.u32, item + 16);
    packU32(y.u32, item + 20);
    packU32(z.u32, item + 24);
  }